

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O0

Matrix3f * __thiscall Matrix3f::inverse(Matrix3f *this,bool *pbIsSingular,float epsilon)

{
  float m00_00;
  float m00_01;
  float m01_00;
  undefined1 auVar1 [16];
  undefined1 *in_RDX;
  float *in_RSI;
  Matrix3f *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float reciprocalDeterminant;
  bool isSingular;
  float determinant;
  float cofactor22;
  float cofactor21;
  float cofactor20;
  float cofactor12;
  float cofactor11;
  float cofactor10;
  float cofactor02;
  float cofactor01;
  float cofactor00;
  float m22;
  float m12;
  float m02;
  float m21;
  float m11;
  float m01;
  float m20;
  float m10;
  float m00;
  
  fVar11 = *in_RSI;
  fVar10 = in_RSI[1];
  fVar7 = in_RSI[2];
  m00_00 = in_RSI[3];
  m00_01 = in_RSI[4];
  fVar8 = in_RSI[5];
  m01_00 = in_RSI[6];
  fVar9 = in_RSI[7];
  fVar6 = in_RSI[8];
  fVar2 = Matrix2f::determinant2x2(m00_01,fVar9,fVar8,fVar6);
  fVar3 = Matrix2f::determinant2x2(fVar10,fVar9,fVar7,fVar6);
  fVar4 = Matrix2f::determinant2x2(fVar10,m00_01,fVar7,fVar8);
  fVar5 = Matrix2f::determinant2x2(m00_00,m01_00,fVar8,fVar6);
  fVar6 = Matrix2f::determinant2x2(fVar11,m01_00,fVar7,fVar6);
  fVar7 = Matrix2f::determinant2x2(fVar11,m00_00,fVar7,fVar8);
  fVar8 = Matrix2f::determinant2x2(m00_00,m01_00,m00_01,fVar9);
  fVar9 = Matrix2f::determinant2x2(fVar11,m01_00,fVar10,fVar9);
  fVar10 = Matrix2f::determinant2x2(fVar11,m00_00,fVar10,m00_01);
  auVar12 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar11),
                            ZEXT416((uint)(m00_00 * -fVar3)));
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)fVar4),ZEXT416((uint)m01_00),auVar12);
  auVar12._0_8_ = (double)auVar1._0_4_;
  auVar12._8_8_ = auVar1._8_8_;
  auVar13._8_8_ = 0x7fffffffffffffff;
  auVar13._0_8_ = 0x7fffffffffffffff;
  auVar12 = vpand_avx(auVar12,auVar13);
  if ((double)in_XMM0_Da <= auVar12._0_8_) {
    if (in_RDX != (undefined1 *)0x0) {
      *in_RDX = 0;
    }
    fVar11 = 1.0 / auVar1._0_4_;
    Matrix3f(in_RDI,fVar2 * fVar11,-fVar5 * fVar11,fVar8 * fVar11,-fVar3 * fVar11,fVar6 * fVar11,
             -fVar9 * fVar11,fVar4 * fVar11,-fVar7 * fVar11,fVar10 * fVar11);
  }
  else {
    if (in_RDX != (undefined1 *)0x0) {
      *in_RDX = 1;
    }
    Matrix3f(in_RDI,0.0);
  }
  return in_RDI;
}

Assistant:

Matrix3f Matrix3f::inverse( bool* pbIsSingular, float epsilon ) const
{
	float m00 = m_elements[ 0 ];
	float m10 = m_elements[ 1 ];
	float m20 = m_elements[ 2 ];

	float m01 = m_elements[ 3 ];
	float m11 = m_elements[ 4 ];
	float m21 = m_elements[ 5 ];

	float m02 = m_elements[ 6 ];
	float m12 = m_elements[ 7 ];
	float m22 = m_elements[ 8 ];

	float cofactor00 =  Matrix2f::determinant2x2( m11, m12, m21, m22 );
	float cofactor01 = -Matrix2f::determinant2x2( m10, m12, m20, m22 );
	float cofactor02 =  Matrix2f::determinant2x2( m10, m11, m20, m21 );

	float cofactor10 = -Matrix2f::determinant2x2( m01, m02, m21, m22 );
	float cofactor11 =  Matrix2f::determinant2x2( m00, m02, m20, m22 );
	float cofactor12 = -Matrix2f::determinant2x2( m00, m01, m20, m21 );

	float cofactor20 =  Matrix2f::determinant2x2( m01, m02, m11, m12 );
	float cofactor21 = -Matrix2f::determinant2x2( m00, m02, m10, m12 );
	float cofactor22 =  Matrix2f::determinant2x2( m00, m01, m10, m11 );

	float determinant = m00 * cofactor00 + m01 * cofactor01 + m02 * cofactor02;
	
	bool isSingular = ( fabs( determinant ) < epsilon );
	if( isSingular )
	{
		if( pbIsSingular != NULL )
		{
			*pbIsSingular = true;
		}
		return Matrix3f();
	}
	else
	{
		if( pbIsSingular != NULL )
		{
			*pbIsSingular = false;
		}

		float reciprocalDeterminant = 1.0f / determinant;

		return Matrix3f
		(
			cofactor00 * reciprocalDeterminant, cofactor10 * reciprocalDeterminant, cofactor20 * reciprocalDeterminant,
			cofactor01 * reciprocalDeterminant, cofactor11 * reciprocalDeterminant, cofactor21 * reciprocalDeterminant,
			cofactor02 * reciprocalDeterminant, cofactor12 * reciprocalDeterminant, cofactor22 * reciprocalDeterminant
		);
	}
}